

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O3

void __thiscall
embree::sse2::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::SubdivRecalculatePrimRef,_2UL>::
TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,SubdivRecalculatePrimRef *recalculatePrimRef)

{
  BBox<embree::Vec3fa> *pBVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  float *pfVar13;
  long lVar14;
  long lVar15;
  size_t i;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar23;
  undefined1 auVar19 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar24;
  float fVar25;
  float fVar29;
  undefined1 auVar26 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  undefined1 auVar28 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar35;
  float fVar36;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  undefined1 auVar34 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar42;
  float fVar43;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar40;
  undefined1 auVar41 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar50;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar51;
  
  fVar16 = time_range.lower;
  fVar23 = time_range.upper;
  fVar38 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar31 = (set->super_PrimInfoMB).max_time_range.upper - fVar38;
  fVar24 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fVar17 = roundf((((fVar16 * 0.5 + fVar23 * 0.5) - fVar38) / fVar31) * fVar24);
  fVar38 = (fVar17 / fVar24) * fVar31 + fVar38;
  if (begin < end && !(bool)(~(fVar16 < fVar38 && fVar38 < fVar23) & 1)) {
    do {
      fVar17 = prims[begin].time_range.upper;
      fVar24 = fVar17 * 0.9999;
      if ((fVar16 < fVar24) && (fVar31 = prims[begin].time_range.lower, fVar31 * 1.0001 < fVar38)) {
        fVar32 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar25 = (fVar16 - fVar31) / (fVar17 - fVar31);
        fVar31 = (fVar38 - fVar31) / (fVar17 - fVar31);
        fVar39 = fVar31 * fVar32;
        fVar17 = floorf(fVar25 * fVar32);
        fVar24 = ceilf(fVar39);
        iVar10 = (int)fVar17;
        if (fVar17 <= 0.0) {
          fVar17 = 0.0;
        }
        fVar18 = fVar24;
        if (fVar32 <= fVar24) {
          fVar18 = fVar32;
        }
        if (iVar10 < 0) {
          iVar10 = -1;
        }
        uVar4 = (int)fVar32 + 1U;
        if ((int)fVar24 < (int)((int)fVar32 + 1U)) {
          uVar4 = (int)fVar24;
        }
        lVar15 = (long)(int)fVar17;
        pBVar1 = recalculatePrimRef->bounds->items;
        uVar12 = (ulong)(uint)prims[begin].lbounds.bounds0.upper.field_0.m128[3] << 0x25 |
                 (ulong)(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3] << 5;
        pfVar13 = (float *)((long)&pBVar1[lVar15].lower.field_0 + uVar12);
        fVar24 = *pfVar13;
        fVar51 = pfVar13[1];
        fVar29 = pfVar13[2];
        fVar30 = pfVar13[3];
        pfVar13 = (float *)((long)&pBVar1[lVar15].upper.field_0 + uVar12);
        fVar35 = *pfVar13;
        fVar36 = pfVar13[1];
        fVar37 = pfVar13[2];
        fVar42 = pfVar13[3];
        lVar14 = (long)(int)fVar18;
        pfVar13 = (float *)((long)&pBVar1[lVar14].lower.field_0 + uVar12);
        fVar43 = *pfVar13;
        fVar44 = pfVar13[1];
        fVar46 = pfVar13[2];
        fVar50 = pfVar13[3];
        pfVar13 = (float *)((long)&pBVar1[lVar14].upper.field_0 + uVar12);
        fVar5 = *pfVar13;
        fVar6 = pfVar13[1];
        fVar7 = pfVar13[2];
        fVar8 = pfVar13[3];
        fVar17 = fVar25 * fVar32 - fVar17;
        if (uVar4 - iVar10 == 1) {
          if (fVar17 <= 0.0) {
            fVar17 = 0.0;
          }
          fVar31 = 1.0 - fVar17;
          auVar49._4_4_ = fVar51 * fVar31 + fVar44 * fVar17;
          auVar49._0_4_ = fVar24 * fVar31 + fVar43 * fVar17;
          fVar18 = fVar18 - fVar39;
          if (fVar18 <= 0.0) {
            fVar18 = 0.0;
          }
          fVar25 = 1.0 - fVar18;
          auVar26._0_4_ = fVar43 * fVar25 + fVar24 * fVar18;
          auVar26._4_4_ = fVar44 * fVar25 + fVar51 * fVar18;
          auVar26._8_4_ = fVar46 * fVar25 + fVar29 * fVar18;
          auVar26._12_4_ = fVar50 * fVar25 + fVar30 * fVar18;
          fVar24 = fVar25 * fVar5 + fVar18 * fVar35;
          fVar39 = fVar25 * fVar6 + fVar18 * fVar36;
          fVar51 = fVar25 * fVar7 + fVar18 * fVar37;
          fVar18 = fVar25 * fVar8 + fVar18 * fVar42;
          auVar22._4_4_ = fVar31 * fVar36 + fVar17 * fVar6;
          auVar22._0_4_ = fVar31 * fVar35 + fVar17 * fVar5;
          auVar22._8_4_ = fVar31 * fVar37 + fVar17 * fVar7;
          auVar22._12_4_ = fVar31 * fVar42 + fVar17 * fVar8;
          auVar49._8_4_ = fVar29 * fVar31 + fVar46 * fVar17;
          auVar49._12_4_ = fVar30 * fVar31 + fVar50 * fVar17;
        }
        else {
          lVar9 = lVar14 * 0x20 + uVar12;
          if (fVar17 <= 0.0) {
            fVar17 = 0.0;
          }
          fVar45 = 1.0 - fVar17;
          auVar49._0_4_ =
               fVar24 * fVar45 +
               *(float *)((long)&pBVar1[lVar15 + 1].lower.field_0 + uVar12) * fVar17;
          auVar49._4_4_ =
               fVar51 * fVar45 +
               *(float *)((long)&pBVar1[lVar15 + 1].lower.field_0 + uVar12 + 4) * fVar17;
          auVar49._8_4_ =
               fVar29 * fVar45 +
               *(float *)((long)&pBVar1[lVar15 + 1].lower.field_0 + uVar12 + 8) * fVar17;
          auVar49._12_4_ =
               fVar30 * fVar45 +
               *(float *)((long)&pBVar1[lVar15 + 1].lower.field_0 + uVar12 + 0xc) * fVar17;
          auVar22._0_4_ =
               fVar35 * fVar45 +
               fVar17 * *(float *)((long)&pBVar1[lVar15 + 1].upper.field_0 + uVar12);
          auVar22._4_4_ =
               fVar36 * fVar45 +
               fVar17 * *(float *)((long)&pBVar1[lVar15 + 1].upper.field_0 + uVar12 + 4);
          auVar22._8_4_ =
               fVar37 * fVar45 +
               fVar17 * *(float *)((long)&pBVar1[lVar15 + 1].upper.field_0 + uVar12 + 8);
          auVar22._12_4_ =
               fVar42 * fVar45 +
               fVar17 * *(float *)((long)&pBVar1[lVar15 + 1].upper.field_0 + uVar12 + 0xc);
          fVar18 = fVar18 - fVar39;
          if (fVar18 <= 0.0) {
            fVar18 = 0.0;
          }
          fVar17 = 1.0 - fVar18;
          auVar26._0_4_ =
               fVar43 * fVar17 +
               *(float *)((long)&pBVar1[lVar14 + -1].lower.field_0 + uVar12) * fVar18;
          auVar26._4_4_ = fVar44 * fVar17 + *(float *)((long)pBVar1 + lVar9 + -0x1c) * fVar18;
          auVar26._8_4_ = fVar46 * fVar17 + *(float *)((long)pBVar1 + lVar9 + -0x18) * fVar18;
          auVar26._12_4_ = fVar50 * fVar17 + *(float *)((long)pBVar1 + lVar9 + -0x14) * fVar18;
          fVar24 = fVar5 * fVar17 + fVar18 * *(float *)((long)pBVar1 + lVar9 + -0x10);
          fVar39 = fVar6 * fVar17 + fVar18 * *(float *)((long)pBVar1 + lVar9 + -0xc);
          fVar51 = fVar7 * fVar17 + fVar18 * *(float *)((long)pBVar1 + lVar9 + -8);
          fVar18 = fVar8 * fVar17 + fVar18 * *(float *)((long)pBVar1 + lVar9 + -4);
          uVar11 = iVar10 + 1;
          if ((int)uVar11 < (int)uVar4) {
            pfVar13 = (float *)((long)&pBVar1[uVar11].upper.field_0 + uVar12);
            do {
              fVar17 = ((float)(int)uVar11 / fVar32 - fVar25) / (fVar31 - fVar25);
              fVar46 = 1.0 - fVar17;
              fVar29 = auVar26._4_4_;
              fVar30 = auVar26._12_4_;
              fVar50 = auVar26._8_4_;
              fVar42 = auVar49._4_4_;
              fVar43 = auVar49._8_4_;
              fVar44 = auVar49._12_4_;
              fVar35 = auVar22._4_4_;
              fVar36 = auVar22._8_4_;
              fVar37 = auVar22._12_4_;
              auVar19._0_4_ = pfVar13[-4] - (auVar49._0_4_ * fVar46 + auVar26._0_4_ * fVar17);
              auVar19._4_4_ = pfVar13[-3] - (fVar42 * fVar46 + fVar29 * fVar17);
              auVar19._8_4_ = pfVar13[-2] - (fVar43 * fVar46 + fVar50 * fVar17);
              auVar19._12_4_ = pfVar13[-1] - (fVar44 * fVar46 + fVar30 * fVar17);
              auVar47._0_4_ = *pfVar13 - (fVar46 * auVar22._0_4_ + fVar17 * fVar24);
              auVar47._4_4_ = pfVar13[1] - (fVar46 * fVar35 + fVar17 * fVar39);
              auVar47._8_4_ = pfVar13[2] - (fVar46 * fVar36 + fVar17 * fVar51);
              auVar47._12_4_ = pfVar13[3] - (fVar46 * fVar37 + fVar17 * fVar18);
              auVar19 = minps(auVar19,ZEXT816(0));
              auVar47 = maxps(auVar47,ZEXT816(0));
              auVar49._0_4_ = auVar49._0_4_ + auVar19._0_4_;
              auVar49._4_4_ = fVar42 + auVar19._4_4_;
              auVar49._8_4_ = fVar43 + auVar19._8_4_;
              auVar49._12_4_ = fVar44 + auVar19._12_4_;
              auVar26._0_4_ = auVar26._0_4_ + auVar19._0_4_;
              auVar26._4_4_ = fVar29 + auVar19._4_4_;
              auVar26._8_4_ = fVar50 + auVar19._8_4_;
              auVar26._12_4_ = fVar30 + auVar19._12_4_;
              auVar22._0_4_ = auVar22._0_4_ + auVar47._0_4_;
              auVar22._4_4_ = fVar35 + auVar47._4_4_;
              auVar22._8_4_ = fVar36 + auVar47._8_4_;
              auVar22._12_4_ = fVar37 + auVar47._12_4_;
              fVar24 = fVar24 + auVar47._0_4_;
              fVar39 = fVar39 + auVar47._4_4_;
              fVar51 = fVar51 + auVar47._8_4_;
              fVar18 = fVar18 + auVar47._12_4_;
              uVar11 = uVar11 + 1;
              pfVar13 = pfVar13 + 8;
            } while (uVar4 != uVar11);
          }
        }
        aVar20.m128 = (__m128)minps(this->bounds0[0].bounds0.lower.field_0,auVar49);
        aVar40.m128 = (__m128)maxps(this->bounds0[0].bounds0.upper.field_0,auVar22);
        aVar33.m128 = (__m128)minps(this->bounds0[0].bounds1.lower.field_0,auVar26);
        auVar2._4_4_ = fVar39;
        auVar2._0_4_ = fVar24;
        auVar2._8_4_ = fVar51;
        auVar2._12_4_ = fVar18;
        aVar27.m128 = (__m128)maxps(this->bounds0[0].bounds1.upper.field_0,auVar2);
        this->bounds0[0].bounds0.lower.field_0 = aVar20;
        this->bounds0[0].bounds0.upper.field_0 = aVar40;
        this->bounds0[0].bounds1.lower.field_0 = aVar33;
        this->bounds0[0].bounds1.upper.field_0 = aVar27;
        fVar32 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar31 = prims[begin].time_range.lower;
        fVar25 = prims[begin].time_range.upper - fVar31;
        fVar24 = floorf(((fVar16 - fVar31) / fVar25) * 1.0000002 * fVar32);
        fVar17 = 0.0;
        if (0.0 <= fVar24) {
          fVar17 = fVar24;
        }
        fVar24 = ceilf(((fVar38 - fVar31) / fVar25) * 0.99999976 * fVar32);
        if (fVar32 <= fVar24) {
          fVar24 = fVar32;
        }
        this->count0[0] = this->count0[0] + (long)((int)fVar24 - (int)fVar17);
        fVar17 = prims[begin].time_range.upper;
        fVar24 = fVar17 * 0.9999;
      }
      if ((fVar38 < fVar24) && (fVar24 = prims[begin].time_range.lower, fVar24 * 1.0001 < fVar23)) {
        fVar32 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar39 = (fVar38 - fVar24) / (fVar17 - fVar24);
        fVar31 = (fVar23 - fVar24) / (fVar17 - fVar24);
        fVar25 = fVar31 * fVar32;
        fVar17 = floorf(fVar39 * fVar32);
        fVar24 = ceilf(fVar25);
        iVar10 = (int)fVar17;
        if (fVar17 <= 0.0) {
          fVar17 = 0.0;
        }
        fVar18 = fVar24;
        if (fVar32 <= fVar24) {
          fVar18 = fVar32;
        }
        if (iVar10 < 0) {
          iVar10 = -1;
        }
        uVar4 = (int)fVar32 + 1U;
        if ((int)fVar24 < (int)((int)fVar32 + 1U)) {
          uVar4 = (int)fVar24;
        }
        lVar15 = (long)(int)fVar17;
        pBVar1 = recalculatePrimRef->bounds->items;
        uVar12 = (ulong)(uint)prims[begin].lbounds.bounds0.upper.field_0.m128[3] << 0x25 |
                 (ulong)(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3] << 5;
        pfVar13 = (float *)((long)&pBVar1[lVar15].lower.field_0 + uVar12);
        fVar24 = *pfVar13;
        fVar51 = pfVar13[1];
        fVar29 = pfVar13[2];
        fVar30 = pfVar13[3];
        pfVar13 = (float *)((long)&pBVar1[lVar15].upper.field_0 + uVar12);
        fVar35 = *pfVar13;
        fVar36 = pfVar13[1];
        fVar37 = pfVar13[2];
        fVar42 = pfVar13[3];
        lVar14 = (long)(int)fVar18;
        pfVar13 = (float *)((long)&pBVar1[lVar14].lower.field_0 + uVar12);
        fVar43 = *pfVar13;
        fVar44 = pfVar13[1];
        fVar46 = pfVar13[2];
        fVar50 = pfVar13[3];
        pfVar13 = (float *)((long)&pBVar1[lVar14].upper.field_0 + uVar12);
        fVar5 = *pfVar13;
        fVar6 = pfVar13[1];
        fVar7 = pfVar13[2];
        fVar8 = pfVar13[3];
        fVar17 = fVar39 * fVar32 - fVar17;
        if (uVar4 - iVar10 == 1) {
          if (fVar17 <= 0.0) {
            fVar17 = 0.0;
          }
          fVar31 = 1.0 - fVar17;
          auVar41._4_4_ = fVar51 * fVar31 + fVar44 * fVar17;
          auVar41._0_4_ = fVar24 * fVar31 + fVar43 * fVar17;
          fVar18 = fVar18 - fVar25;
          if (fVar18 <= 0.0) {
            fVar18 = 0.0;
          }
          fVar32 = 1.0 - fVar18;
          auVar28._0_4_ = fVar43 * fVar32 + fVar24 * fVar18;
          auVar28._4_4_ = fVar44 * fVar32 + fVar51 * fVar18;
          auVar28._8_4_ = fVar46 * fVar32 + fVar29 * fVar18;
          auVar28._12_4_ = fVar50 * fVar32 + fVar30 * fVar18;
          fVar24 = fVar32 * fVar5 + fVar18 * fVar35;
          fVar25 = fVar32 * fVar6 + fVar18 * fVar36;
          fVar51 = fVar32 * fVar7 + fVar18 * fVar37;
          fVar18 = fVar32 * fVar8 + fVar18 * fVar42;
          auVar34._4_4_ = fVar31 * fVar36 + fVar17 * fVar6;
          auVar34._0_4_ = fVar31 * fVar35 + fVar17 * fVar5;
          auVar34._8_4_ = fVar31 * fVar37 + fVar17 * fVar7;
          auVar34._12_4_ = fVar31 * fVar42 + fVar17 * fVar8;
          auVar41._8_4_ = fVar29 * fVar31 + fVar46 * fVar17;
          auVar41._12_4_ = fVar30 * fVar31 + fVar50 * fVar17;
        }
        else {
          lVar9 = lVar14 * 0x20 + uVar12;
          if (fVar17 <= 0.0) {
            fVar17 = 0.0;
          }
          fVar45 = 1.0 - fVar17;
          auVar41._0_4_ =
               fVar24 * fVar45 +
               *(float *)((long)&pBVar1[lVar15 + 1].lower.field_0 + uVar12) * fVar17;
          auVar41._4_4_ =
               fVar51 * fVar45 +
               *(float *)((long)&pBVar1[lVar15 + 1].lower.field_0 + uVar12 + 4) * fVar17;
          auVar41._8_4_ =
               fVar29 * fVar45 +
               *(float *)((long)&pBVar1[lVar15 + 1].lower.field_0 + uVar12 + 8) * fVar17;
          auVar41._12_4_ =
               fVar30 * fVar45 +
               *(float *)((long)&pBVar1[lVar15 + 1].lower.field_0 + uVar12 + 0xc) * fVar17;
          auVar34._0_4_ =
               fVar35 * fVar45 +
               fVar17 * *(float *)((long)&pBVar1[lVar15 + 1].upper.field_0 + uVar12);
          auVar34._4_4_ =
               fVar36 * fVar45 +
               fVar17 * *(float *)((long)&pBVar1[lVar15 + 1].upper.field_0 + uVar12 + 4);
          auVar34._8_4_ =
               fVar37 * fVar45 +
               fVar17 * *(float *)((long)&pBVar1[lVar15 + 1].upper.field_0 + uVar12 + 8);
          auVar34._12_4_ =
               fVar42 * fVar45 +
               fVar17 * *(float *)((long)&pBVar1[lVar15 + 1].upper.field_0 + uVar12 + 0xc);
          fVar18 = fVar18 - fVar25;
          if (fVar18 <= 0.0) {
            fVar18 = 0.0;
          }
          fVar17 = 1.0 - fVar18;
          auVar28._0_4_ =
               fVar43 * fVar17 +
               *(float *)((long)&pBVar1[lVar14 + -1].lower.field_0 + uVar12) * fVar18;
          auVar28._4_4_ = fVar44 * fVar17 + *(float *)((long)pBVar1 + lVar9 + -0x1c) * fVar18;
          auVar28._8_4_ = fVar46 * fVar17 + *(float *)((long)pBVar1 + lVar9 + -0x18) * fVar18;
          auVar28._12_4_ = fVar50 * fVar17 + *(float *)((long)pBVar1 + lVar9 + -0x14) * fVar18;
          fVar24 = fVar5 * fVar17 + fVar18 * *(float *)((long)pBVar1 + lVar9 + -0x10);
          fVar25 = fVar6 * fVar17 + fVar18 * *(float *)((long)pBVar1 + lVar9 + -0xc);
          fVar51 = fVar7 * fVar17 + fVar18 * *(float *)((long)pBVar1 + lVar9 + -8);
          fVar18 = fVar8 * fVar17 + fVar18 * *(float *)((long)pBVar1 + lVar9 + -4);
          uVar11 = iVar10 + 1;
          if ((int)uVar11 < (int)uVar4) {
            pfVar13 = (float *)((long)&pBVar1[uVar11].upper.field_0 + uVar12);
            do {
              fVar17 = ((float)(int)uVar11 / fVar32 - fVar39) / (fVar31 - fVar39);
              fVar46 = 1.0 - fVar17;
              fVar29 = auVar28._4_4_;
              fVar30 = auVar28._12_4_;
              fVar50 = auVar28._8_4_;
              fVar42 = auVar41._4_4_;
              fVar43 = auVar41._8_4_;
              fVar44 = auVar41._12_4_;
              fVar35 = auVar34._4_4_;
              fVar36 = auVar34._8_4_;
              fVar37 = auVar34._12_4_;
              auVar21._0_4_ = pfVar13[-4] - (auVar41._0_4_ * fVar46 + auVar28._0_4_ * fVar17);
              auVar21._4_4_ = pfVar13[-3] - (fVar42 * fVar46 + fVar29 * fVar17);
              auVar21._8_4_ = pfVar13[-2] - (fVar43 * fVar46 + fVar50 * fVar17);
              auVar21._12_4_ = pfVar13[-1] - (fVar44 * fVar46 + fVar30 * fVar17);
              auVar48._0_4_ = *pfVar13 - (fVar46 * auVar34._0_4_ + fVar17 * fVar24);
              auVar48._4_4_ = pfVar13[1] - (fVar46 * fVar35 + fVar17 * fVar25);
              auVar48._8_4_ = pfVar13[2] - (fVar46 * fVar36 + fVar17 * fVar51);
              auVar48._12_4_ = pfVar13[3] - (fVar46 * fVar37 + fVar17 * fVar18);
              auVar22 = minps(auVar21,ZEXT816(0));
              auVar49 = maxps(auVar48,ZEXT816(0));
              auVar41._0_4_ = auVar41._0_4_ + auVar22._0_4_;
              auVar41._4_4_ = fVar42 + auVar22._4_4_;
              auVar41._8_4_ = fVar43 + auVar22._8_4_;
              auVar41._12_4_ = fVar44 + auVar22._12_4_;
              auVar28._0_4_ = auVar28._0_4_ + auVar22._0_4_;
              auVar28._4_4_ = fVar29 + auVar22._4_4_;
              auVar28._8_4_ = fVar50 + auVar22._8_4_;
              auVar28._12_4_ = fVar30 + auVar22._12_4_;
              auVar34._0_4_ = auVar34._0_4_ + auVar49._0_4_;
              auVar34._4_4_ = fVar35 + auVar49._4_4_;
              auVar34._8_4_ = fVar36 + auVar49._8_4_;
              auVar34._12_4_ = fVar37 + auVar49._12_4_;
              fVar24 = fVar24 + auVar49._0_4_;
              fVar25 = fVar25 + auVar49._4_4_;
              fVar51 = fVar51 + auVar49._8_4_;
              fVar18 = fVar18 + auVar49._12_4_;
              uVar11 = uVar11 + 1;
              pfVar13 = pfVar13 + 8;
            } while (uVar4 != uVar11);
          }
        }
        aVar20.m128 = (__m128)minps(this->bounds1[0].bounds0.lower.field_0,auVar41);
        aVar40.m128 = (__m128)maxps(this->bounds1[0].bounds0.upper.field_0,auVar34);
        aVar33.m128 = (__m128)minps(this->bounds1[0].bounds1.lower.field_0,auVar28);
        auVar3._4_4_ = fVar25;
        auVar3._0_4_ = fVar24;
        auVar3._8_4_ = fVar51;
        auVar3._12_4_ = fVar18;
        aVar27.m128 = (__m128)maxps(this->bounds1[0].bounds1.upper.field_0,auVar3);
        this->bounds1[0].bounds0.lower.field_0 = aVar20;
        this->bounds1[0].bounds0.upper.field_0 = aVar40;
        this->bounds1[0].bounds1.lower.field_0 = aVar33;
        this->bounds1[0].bounds1.upper.field_0 = aVar27;
        fVar32 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        fVar31 = prims[begin].time_range.lower;
        fVar25 = prims[begin].time_range.upper - fVar31;
        fVar24 = floorf(((fVar38 - fVar31) / fVar25) * 1.0000002 * fVar32);
        fVar17 = 0.0;
        if (0.0 <= fVar24) {
          fVar17 = fVar24;
        }
        fVar24 = ceilf(((fVar23 - fVar31) / fVar25) * 0.99999976 * fVar32);
        if (fVar32 <= fVar24) {
          fVar24 = fVar32;
        }
        this->count1[0] = this->count1[0] + (long)((int)fVar24 - (int)fVar17);
      }
      begin = begin + 1;
    } while (begin != end);
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }